

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O0

bool vkt::tessellation::anon_unknown_0::verifyResultImage
               (TestLog *log,int numPrimitives,int numAttribsPerPrimitive,
               TessPrimitiveType primitiveType,vector<float,_std::allocator<float>_> *attributes,
               ConstPixelBufferAccess *pixels)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  MessageBuilder *pMVar7;
  TestLog *pTVar8;
  float *outer;
  byte local_912;
  byte local_911;
  Vector<int,_2> local_8f4;
  byte local_8e9;
  string local_8e8;
  byte local_8c2;
  byte local_8c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  byte local_87a;
  byte local_879;
  string local_878;
  byte local_853;
  byte local_852;
  byte local_851;
  string local_850;
  byte local_82b;
  byte local_82a;
  byte local_829;
  string local_828;
  byte local_802;
  byte local_801;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  MessageBuilder local_700;
  MessageBuilder local_580;
  undefined1 local_400 [24];
  int x_1;
  int y_1;
  MessageBuilder local_3b8;
  MessageBuilder local_238;
  undefined1 local_b4 [24];
  int x;
  int y;
  uint uStack_94;
  bool pixelOk;
  int y1;
  int y0;
  int x1;
  int x0;
  float *offset;
  float *scale;
  tessellation *ptStack_70;
  bool validLevels;
  float *attr;
  int patchNdx;
  int lastWhitePixelColumnOnSecondToLastWhitePixelRow;
  int secondToLastWhitePixelRow;
  int lastWhitePixelRow;
  Vec4 white;
  Vec4 black;
  ConstPixelBufferAccess *pixels_local;
  vector<float,_std::allocator<float>_> *attributes_local;
  TessPrimitiveType primitiveType_local;
  int numAttribsPerPrimitive_local;
  int numPrimitives_local;
  TestLog *log_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(white.m_data + 2),0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&secondToLastWhitePixelRow,1.0,1.0,1.0,1.0);
  lastWhitePixelColumnOnSecondToLastWhitePixelRow = 0;
  patchNdx = 0;
  attr._4_4_ = 0;
  attr._0_4_ = 0;
  while( true ) {
    if (numPrimitives <= (int)attr) {
      return true;
    }
    ptStack_70 = (tessellation *)
                 std::vector<float,_std::allocator<float>_>::operator[]
                           (attributes,(long)(numAttribsPerPrimitive * (int)attr));
    bVar4 = isPatchDiscarded(primitiveType,(float *)(ptStack_70 + 8));
    scale._7_1_ = (bVar4 ^ 0xffU) & 1;
    if (scale._7_1_ == 0) break;
    offset = (float *)(ptStack_70 + 0x18);
    _x1 = ptStack_70 + 0x20;
    fVar1 = *(float *)_x1;
    iVar5 = tcu::ConstPixelBufferAccess::getWidth(pixels);
    y0 = (int)((fVar1 + 1.0) * 0.5 * (float)iVar5) + -1;
    fVar1 = *offset;
    fVar2 = *(float *)_x1;
    iVar5 = tcu::ConstPixelBufferAccess::getWidth(pixels);
    y1 = (int)((fVar1 + fVar2 + 1.0) * 0.5 * (float)iVar5) + 1;
    fVar1 = *(float *)(_x1 + 4);
    iVar5 = tcu::ConstPixelBufferAccess::getHeight(pixels);
    uStack_94 = (int)((fVar1 + 1.0) * 0.5 * (float)iVar5) - 1;
    fVar1 = offset[1];
    fVar2 = *(float *)(_x1 + 4);
    iVar5 = tcu::ConstPixelBufferAccess::getHeight(pixels);
    y = (int)((fVar1 + fVar2 + 1.0) * 0.5 * (float)iVar5) + 1;
    x._3_1_ = 0;
    if (lastWhitePixelColumnOnSecondToLastWhitePixelRow < y) {
      patchNdx = lastWhitePixelColumnOnSecondToLastWhitePixelRow;
      lastWhitePixelColumnOnSecondToLastWhitePixelRow = y;
    }
    attr._4_4_ = y1;
    local_b4._20_4_ = uStack_94;
    while( true ) {
      outer = (float *)(ulong)(uint)local_b4._20_4_;
      local_911 = 0;
      if ((int)local_b4._20_4_ <= y) {
        local_911 = x._3_1_ ^ 0xff;
      }
      if ((local_911 & 1) == 0) break;
      local_b4._16_4_ = y0;
      while( true ) {
        uVar3 = local_b4._16_4_;
        local_912 = 0;
        if ((int)local_b4._16_4_ <= y1) {
          local_912 = x._3_1_ ^ 0xff;
        }
        if ((local_912 & 1) == 0) break;
        iVar5 = tcu::ConstPixelBufferAccess::getWidth(pixels);
        bVar4 = de::inBounds<int>(uVar3,0,iVar5);
        uVar3 = local_b4._20_4_;
        if (bVar4) {
          iVar5 = tcu::ConstPixelBufferAccess::getHeight(pixels);
          bVar4 = de::inBounds<int>(uVar3,0,iVar5);
          if (bVar4) {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_b4,(int)pixels,local_b4._16_4_,
                       local_b4._20_4_);
            bVar4 = tcu::Vector<float,_4>::operator==
                              ((Vector<float,_4> *)local_b4,
                               (Vector<float,_4> *)&secondToLastWhitePixelRow);
            if (bVar4) {
              x._3_1_ = 1;
            }
          }
        }
        local_b4._16_4_ = local_b4._16_4_ + 1;
      }
      local_b4._20_4_ = local_b4._20_4_ + 1;
    }
    if ((x._3_1_ & 1) == 0) {
      tcu::TestLog::operator<<(&local_3b8,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_3b8,
                          (char (*) [61])
                          "Failure: expected at least one white pixel in the rectangle ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [5])"[x0=");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&y0);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [6])", y0=");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&stack0xffffffffffffff6c);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [6])", x1=");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&y1);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [6])", y1=");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&y);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x131325b);
      pTVar8 = tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_238,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_238,
                          (char (*) [92])
                          "Note: the rectangle approximately corresponds to the patch with these tessellation levels: "
                         );
      getTessellationLevelsString_abi_cxx11_
                ((string *)&x_1,ptStack_70,(float *)(ptStack_70 + 4),outer);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&x_1);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&x_1);
      tcu::MessageBuilder::~MessageBuilder(&local_238);
      tcu::MessageBuilder::~MessageBuilder(&local_3b8);
      return false;
    }
    attr._0_4_ = (int)attr + 1;
  }
  local_400._20_4_ = 0;
  scale._7_1_ = 0;
  do {
    uVar3 = local_400._20_4_;
    iVar5 = tcu::ConstPixelBufferAccess::getHeight(pixels);
    if (iVar5 <= (int)uVar3) {
      return true;
    }
    for (local_400._16_4_ = 0; uVar3 = local_400._16_4_,
        iVar5 = tcu::ConstPixelBufferAccess::getWidth(pixels), (int)uVar3 < iVar5;
        local_400._16_4_ = local_400._16_4_ + 1) {
      if ((lastWhitePixelColumnOnSecondToLastWhitePixelRow < (int)local_400._20_4_) ||
         ((patchNdx < (int)local_400._20_4_ && (attr._4_4_ < (int)local_400._16_4_)))) {
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)local_400,(int)pixels,local_400._16_4_,local_400._20_4_
                  );
        bVar4 = tcu::Vector<float,_4>::operator!=
                          ((Vector<float,_4> *)local_400,(Vector<float,_4> *)(white.m_data + 2));
        if (bVar4) {
          tcu::TestLog::operator<<(&local_700,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_700,
                              (char (*) [54])"Failure: expected all pixels to be black in the area "
                             );
          iVar5 = attr._4_4_;
          local_801 = 0;
          local_802 = 0;
          local_829 = 0;
          local_82a = 0;
          local_82b = 0;
          local_851 = 0;
          local_852 = 0;
          local_853 = 0;
          local_879 = 0;
          local_87a = 0;
          local_8c1 = 0;
          local_8c2 = 0;
          local_8e9 = 0;
          iVar6 = tcu::ConstPixelBufferAccess::getWidth(pixels);
          if (iVar5 < iVar6 + -1) {
            std::__cxx11::string::string((string *)&local_800);
            local_801 = 1;
            std::operator+(&local_7e0,&local_800,"y > ");
            local_802 = 1;
            de::toString<int>(&local_828,&lastWhitePixelColumnOnSecondToLastWhitePixelRow);
            local_829 = 1;
            std::operator+(&local_7c0,&local_7e0,&local_828);
            local_82a = 1;
            std::operator+(&local_7a0,&local_7c0," || (y > ");
            local_82b = 1;
            de::toString<int>(&local_850,&patchNdx);
            local_851 = 1;
            std::operator+(&local_780,&local_7a0,&local_850);
            local_852 = 1;
            std::operator+(&local_760,&local_780," && x > ");
            local_853 = 1;
            de::toString<int>(&local_878,(int *)((long)&attr + 4));
            local_879 = 1;
            std::operator+(&local_740,&local_760,&local_878);
            local_87a = 1;
            std::operator+(&local_720,&local_740,")");
          }
          else {
            std::__cxx11::string::string((string *)&local_8c0);
            local_8c1 = 1;
            std::operator+(&local_8a0,&local_8c0,"y > ");
            local_8c2 = 1;
            de::toString<int>(&local_8e8,&lastWhitePixelColumnOnSecondToLastWhitePixelRow);
            local_8e9 = 1;
            std::operator+(&local_720,&local_8a0,&local_8e8);
          }
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_720);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (pMVar7,(char (*) [59])
                                     " (they all correspond to patches that should be discarded)");
          pTVar8 = tcu::MessageBuilder::operator<<
                             (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_580,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<(&local_580,(char (*) [13])"Note: pixel ");
          tcu::Vector<int,_2>::Vector(&local_8f4,local_400._16_4_,local_400._20_4_);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_8f4);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])" isn\'t black");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_580);
          std::__cxx11::string::~string((string *)&local_720);
          if ((local_8e9 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_8e8);
          }
          if ((local_8c2 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_8a0);
          }
          if ((local_8c1 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_8c0);
          }
          if ((local_87a & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_740);
          }
          if ((local_879 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_878);
          }
          if ((local_853 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_760);
          }
          if ((local_852 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_780);
          }
          if ((local_851 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_850);
          }
          if ((local_82b & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_7a0);
          }
          if ((local_82a & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_7c0);
          }
          if ((local_829 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_828);
          }
          if ((local_802 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_7e0);
          }
          if ((local_801 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_800);
          }
          tcu::MessageBuilder::~MessageBuilder(&local_700);
          return false;
        }
      }
    }
    local_400._20_4_ = local_400._20_4_ + 1;
  } while( true );
}

Assistant:

bool verifyResultImage (tcu::TestLog&						log,
						const int							numPrimitives,
						const int							numAttribsPerPrimitive,
						const TessPrimitiveType				primitiveType,
						const std::vector<float>&			attributes,
						const tcu::ConstPixelBufferAccess	pixels)
{
	const tcu::Vec4 black(0.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 white(1.0f, 1.0f, 1.0f, 1.0f);

	int lastWhitePixelRow								= 0;
	int secondToLastWhitePixelRow						= 0;
	int	lastWhitePixelColumnOnSecondToLastWhitePixelRow	= 0;

	for (int patchNdx = 0; patchNdx < numPrimitives; ++patchNdx)
	{
		const float* const	attr			= &attributes[numAttribsPerPrimitive*patchNdx];
		const bool			validLevels		= !isPatchDiscarded(primitiveType, &attr[2]);

		if (validLevels)
		{
			// Not a discarded patch; check that at least one white pixel is found in its area.

			const float* const	scale		= &attr[6];
			const float* const	offset		= &attr[8];
			const int			x0			= (int)((			offset[0] + 1.0f) * 0.5f * (float)pixels.getWidth()) - 1;
			const int			x1			= (int)((scale[0] + offset[0] + 1.0f) * 0.5f * (float)pixels.getWidth()) + 1;
			const int			y0			= (int)((			offset[1] + 1.0f) * 0.5f * (float)pixels.getHeight()) - 1;
			const int			y1			= (int)((scale[1] + offset[1] + 1.0f) * 0.5f * (float)pixels.getHeight()) + 1;
			bool				pixelOk		= false;

			if (y1 > lastWhitePixelRow)
			{
				secondToLastWhitePixelRow	= lastWhitePixelRow;
				lastWhitePixelRow			= y1;
			}
			lastWhitePixelColumnOnSecondToLastWhitePixelRow = x1;

			for (int y = y0; y <= y1 && !pixelOk; y++)
			for (int x = x0; x <= x1 && !pixelOk; x++)
			{
				if (!de::inBounds(x, 0, pixels.getWidth()) || !de::inBounds(y, 0, pixels.getHeight()))
					continue;

				if (pixels.getPixel(x, y) == white)
					pixelOk = true;
			}

			if (!pixelOk)
			{
				log << tcu::TestLog::Message
					<< "Failure: expected at least one white pixel in the rectangle "
					<< "[x0=" << x0 << ", y0=" << y0 << ", x1=" << x1 << ", y1=" << y1 << "]"
					<< tcu::TestLog::EndMessage
					<< tcu::TestLog::Message
					<< "Note: the rectangle approximately corresponds to the patch with these tessellation levels: "
					<< getTessellationLevelsString(&attr[0], &attr[1])
					<< tcu::TestLog::EndMessage;

				return false;
			}
		}
		else
		{
			// First discarded primitive patch; the remaining are guaranteed to be discarded ones as well.

			for (int y = 0; y < pixels.getHeight(); y++)
			for (int x = 0; x < pixels.getWidth(); x++)
			{
				if (y > lastWhitePixelRow || (y > secondToLastWhitePixelRow && x > lastWhitePixelColumnOnSecondToLastWhitePixelRow))
				{
					if (pixels.getPixel(x, y) != black)
					{
						log << tcu::TestLog::Message
							<< "Failure: expected all pixels to be black in the area "
							<< (lastWhitePixelColumnOnSecondToLastWhitePixelRow < pixels.getWidth()-1
								? std::string() + "y > " + de::toString(lastWhitePixelRow) + " || (y > " + de::toString(secondToLastWhitePixelRow)
												+ " && x > " + de::toString(lastWhitePixelColumnOnSecondToLastWhitePixelRow) + ")"
								: std::string() + "y > " + de::toString(lastWhitePixelRow))
							<< " (they all correspond to patches that should be discarded)"
							<< tcu::TestLog::EndMessage
							<< tcu::TestLog::Message << "Note: pixel " << tcu::IVec2(x, y) << " isn't black" << tcu::TestLog::EndMessage;

						return false;
					}
				}
			}
			break;
		}
	}
	return true;
}